

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TArray<WadStuff,_WadStuff>::DoDelete(TArray<WadStuff,_WadStuff> *this,uint first,uint last)

{
  long lVar1;
  ulong uVar2;
  
  if (last != 0xffffffff) {
    uVar2 = (ulong)first;
    lVar1 = uVar2 * 0x18;
    for (; uVar2 <= last; uVar2 = uVar2 + 1) {
      WadStuff::~WadStuff((WadStuff *)((long)&(this->Array->Path).Chars + lVar1));
      lVar1 = lVar1 + 0x18;
    }
    return;
  }
  __assert_fail("last != ~0u",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                ,0x1ad,
                "void TArray<WadStuff>::DoDelete(unsigned int, unsigned int) [T = WadStuff, TT = WadStuff]"
               );
}

Assistant:

void DoDelete (unsigned int first, unsigned int last)
	{
		assert (last != ~0u);
		for (unsigned int i = first; i <= last; ++i)
		{
			Array[i].~T();
		}
	}